

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack27_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar6 = *(undefined1 (*) [16])(in + 1);
  auVar5 = vpmovsxbd_avx(ZEXT416(0x2010004));
  uVar1 = *in;
  uVar2 = in[5];
  uVar3 = in[6];
  *out = uVar1 & 0x7ffffff;
  uVar4 = in[4];
  auVar5 = vpermi2d_avx512vl(auVar5,auVar6,ZEXT416(uVar1));
  auVar5 = vpshldvd_avx512_vbmi2(auVar6,auVar5,_DAT_001a1160);
  auVar6._8_4_ = 0x7ffffff;
  auVar6._0_8_ = 0x7ffffff07ffffff;
  auVar6._12_4_ = 0x7ffffff;
  auVar6 = vpandd_avx512vl(auVar5,auVar6);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  out[5] = uVar4 >> 7 | (uVar2 & 3) << 0x19;
  out[6] = uVar2 >> 2 & 0x7ffffff;
  out[7] = (uVar3 & 0xffffff) << 3 | uVar2 >> 0x1d;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack27_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;

  return in + 1;
}